

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::Expression::PropagationVisitor::visit<slang::ast::UnbasedUnsizedIntegerLiteral>
          (PropagationVisitor *this,UnbasedUnsizedIntegerLiteral *expr)

{
  ExpressionKind EVar1;
  Type *pTVar2;
  SourceLocation SVar3;
  bool bVar4;
  bool bVar5;
  Type *pTVar6;
  
  bVar4 = bad(&expr->super_Expression);
  if (bVar4) {
    return &expr->super_Expression;
  }
  pTVar2 = this->newType;
  pTVar6 = pTVar2->canonical;
  if (pTVar6 == (Type *)0x0) {
    Type::resolveCanonical(pTVar2);
    pTVar6 = pTVar2->canonical;
  }
  if ((pTVar6->super_Symbol).kind == ErrorType) {
    (expr->super_Expression).type.ptr = this->newType;
    return &expr->super_Expression;
  }
  bVar4 = Type::isEquivalent(this->newType,(expr->super_Expression).type.ptr);
  pTVar2 = this->newType;
  pTVar6 = pTVar2->canonical;
  if (pTVar6 == (Type *)0x0) {
    Type::resolveCanonical(pTVar2);
    pTVar6 = pTVar2->canonical;
  }
  if ((pTVar6->super_Symbol).kind == FloatingType) {
    pTVar2 = (expr->super_Expression).type.ptr;
    pTVar6 = pTVar2->canonical;
    if (pTVar6 == (Type *)0x0) {
      Type::resolveCanonical(pTVar2);
      pTVar6 = pTVar2->canonical;
    }
    if ((pTVar6->super_Symbol).kind != FloatingType) goto LAB_002de86e;
  }
  else {
LAB_002de86e:
    bVar5 = Type::isIntegral(this->newType);
    if ((!bVar5) || (bVar5 = Type::isIntegral((expr->super_Expression).type.ptr), !bVar5)) {
      pTVar2 = this->newType;
      pTVar6 = pTVar2->canonical;
      if (pTVar6 == (Type *)0x0) {
        Type::resolveCanonical(pTVar2);
        pTVar6 = pTVar2->canonical;
      }
      if (((pTVar6->super_Symbol).kind != StringType) &&
         ((expr->super_Expression).kind != ValueRange)) goto LAB_002de931;
    }
  }
  if (bVar4) {
    (this->opRange).startLoc = (SourceLocation)0x0;
    (this->opRange).endLoc = (SourceLocation)0x0;
    EVar1 = (expr->super_Expression).kind;
    if (EVar1 == ConditionalOp) {
      SVar3 = (SourceLocation)expr[1].super_Expression.type.ptr;
      (this->opRange).startLoc = SVar3;
      (this->opRange).endLoc =
           (SourceLocation)
           ((long)SVar3 * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
           (ulong)(SVar3._0_4_ & 0xfffffff));
    }
    else if (EVar1 == BinaryOp) {
      SVar3 = (SourceLocation)expr[1].super_Expression.syntax;
      (this->opRange).startLoc = (SourceLocation)expr[1].super_Expression.constant;
      (this->opRange).endLoc = SVar3;
    }
  }
  bVar5 = UnbasedUnsizedIntegerLiteral::propagateType
                    (expr,this->context,this->newType,this->opRange,this->conversionKind);
  if (bVar5) {
    (expr->super_Expression).constant = (ConstantValue *)0x0;
    return &expr->super_Expression;
  }
LAB_002de931:
  if (!bVar4) {
    expr = (UnbasedUnsizedIntegerLiteral *)
           ConversionExpression::makeImplicit
                     (this->context,this->newType,this->conversionKind,&expr->super_Expression,
                      this->parentExpr,this->opRange);
  }
  return &expr->super_Expression;
}

Assistant:

Expression& visit(T& expr) {
        if (expr.bad())
            return expr;

        if (newType.isError()) {
            expr.type = &newType;
            return expr;
        }

        // If the new type is equivalent to the old type, there's no need for a
        // conversion. Otherwise if both types are integral or both are real, we have to
        // check if the conversion should be pushed further down the tree. Otherwise we
        // should insert the implicit conversion here.
        bool needConversion = !newType.isEquivalent(*expr.type);
        if constexpr (requires { expr.propagateType(context, newType, opRange, conversionKind); }) {
            if ((newType.isFloating() && expr.type->isFloating()) ||
                (newType.isIntegral() && expr.type->isIntegral()) || newType.isString() ||
                expr.kind == ExpressionKind::ValueRange) {

                if (!needConversion) {
                    // If we don't need a conversion here we still need to call propagateType as
                    // one of our child expressions may still need conversion. However, we shouldn't
                    // pass along our given opRange since we didn't need the conversion here, so our
                    // parent operator isn't relevant. We should try to refigure an opRange for our
                    // most immediate parent expression instead.
                    updateRange(expr);
                }

                if (expr.propagateType(context, newType, opRange, conversionKind)) {
                    // We propagated the type successfully so we don't need a conversion.
                    // We should however clear out any constant value that may have been
                    // stored here, since it may no longer be valid given the new type.
                    needConversion = false;
                    expr.constant = nullptr;
                }
            }
        }

        Expression* result = &expr;
        if (needConversion) {
            result = &ConversionExpression::makeImplicit(context, newType, conversionKind, expr,
                                                         parentExpr, opRange);
        }

        return *result;
    }